

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O0

int PGSStreamReader::calcFpsIndex(double fps)

{
  VodCoreException *this;
  double local_1d0;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream ss;
  int local_14;
  int i;
  double fps_local;
  
  local_14 = 0;
  while( true ) {
    if (0xf < local_14) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,
                      "Non standard fps value are not supported for PGS streams");
      this = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this,3,&local_1c0);
      __cxa_throw(this,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if (pgs_frame_rates[local_14] - fps < 0.0) {
      local_1d0 = -(pgs_frame_rates[local_14] - fps);
    }
    else {
      local_1d0 = pgs_frame_rates[local_14] - fps;
    }
    if (local_1d0 < 0.0001) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int PGSStreamReader::calcFpsIndex(const double fps)
{
    for (int i = 0; i < 16; i++)
        if (fabs(pgs_frame_rates[i] - fps) < 1e-4)
            return i;
    THROW(ERR_COMMON, "Non standard fps value are not supported for PGS streams")
}